

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O0

int IDAGetWorkSpace(void *ida_mem,long *lenrw,long *leniw)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x4c6,"IDAGetWorkSpace",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    *in_RDX = *(undefined8 *)(in_RDI + 0x3b0);
    *in_RSI = *(undefined8 *)(in_RDI + 0x3a8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetWorkSpace(void* ida_mem, long int* lenrw, long int* leniw)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *leniw = IDA_mem->ida_liw;
  *lenrw = IDA_mem->ida_lrw;

  return (IDA_SUCCESS);
}